

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

double calculate_sd<sparse_parameters>(vw *param_1,sparse_parameters *weights)

{
  sparse_iterator<float> __last;
  sparse_iterator<float> __last_00;
  sparse_iterator<float> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first1;
  sparse_iterator<float> __first_00;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last1;
  uint32_t uVar2;
  vector<double,_std::allocator<double>_> *this;
  double dVar3;
  iterator iVar4;
  double sq_sum;
  vector<double,_std::allocator<double>_> diff;
  double mean;
  double sum;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe58;
  anon_class_8_1_898ec0c3 in_stack_fffffffffffffe60;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> in_stack_fffffffffffffe68;
  undefined1 *__init;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined1 local_c0 [24];
  double local_a8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_a0;
  uint32_t local_98;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_90;
  uint32_t local_88;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_80;
  uint32_t local_78;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_70;
  uint32_t local_68;
  double local_60;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_50;
  uint32_t local_48;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_40;
  uint32_t local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_30;
  uint32_t local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_20;
  uint32_t local_18;
  
  iVar4 = sparse_parameters::begin((sparse_parameters *)in_stack_fffffffffffffe60.mean);
  local_30._M_cur =
       (__node_type *)
       iVar4._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur;
  local_28 = iVar4._stride;
  local_20._M_cur = local_30._M_cur;
  local_18 = local_28;
  iVar4 = sparse_parameters::end((sparse_parameters *)in_stack_fffffffffffffe60.mean);
  local_50._M_cur =
       (__node_type *)
       iVar4._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur;
  local_48 = iVar4._stride;
  local_40._M_cur = local_50._M_cur;
  local_38 = local_48;
  std::
  for_each<sparse_iterator<float>,calculate_sd<sparse_parameters>(vw&,sparse_parameters&)::_lambda(float)_1_>
            (local_20._M_cur,local_18,local_50._M_cur,local_48);
  iVar4 = sparse_parameters::begin((sparse_parameters *)in_stack_fffffffffffffe60.mean);
  local_80._M_cur =
       (__node_type *)
       iVar4._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur;
  local_78 = iVar4._stride;
  local_70._M_cur = local_80._M_cur;
  local_68 = local_78;
  iVar4 = sparse_parameters::end((sparse_parameters *)in_stack_fffffffffffffe60.mean);
  local_a0._M_cur =
       (__node_type *)
       iVar4._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur;
  local_98 = iVar4._stride;
  __first._stride = in_stack_fffffffffffffe80;
  __first._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       in_stack_fffffffffffffe78;
  __first._12_4_ = in_stack_fffffffffffffe84;
  __last._8_8_ = in_stack_fffffffffffffe70._M_cur;
  __last._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       in_stack_fffffffffffffe68._M_cur;
  local_90._M_cur = local_a0._M_cur;
  local_88 = local_98;
  local_60 = std::accumulate<sparse_iterator<float>,double>
                       (__first,__last,in_stack_fffffffffffffe60.mean);
  local_a8 = local_60 / (double)calculate_sd<sparse_parameters>::my_size;
  std::allocator<double>::allocator((allocator<double> *)0x3afcdd);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78
             ,(allocator_type *)in_stack_fffffffffffffe70._M_cur);
  std::allocator<double>::~allocator((allocator<double> *)0x3afd03);
  sparse_parameters::begin((sparse_parameters *)in_stack_fffffffffffffe60.mean);
  iVar4 = sparse_parameters::end((sparse_parameters *)in_stack_fffffffffffffe60.mean);
  _Var1._M_cur = (__node_type *)
                 iVar4._iter.
                 super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur;
  uVar2 = iVar4._stride;
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe58);
  __first_00._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur.
  _4_4_ = uVar2;
  __first_00._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur.
  _0_4_ = in_stack_fffffffffffffe80;
  __first_00._8_8_ = _Var1._M_cur;
  __last_00._8_8_ = in_stack_fffffffffffffe78;
  __last_00._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       in_stack_fffffffffffffe70._M_cur;
  __last1 = std::
            transform<sparse_iterator<float>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,calculate_sd<sparse_parameters>(vw&,sparse_parameters&)::_lambda(double)_1_>
                      (__first_00,__last_00,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                       in_stack_fffffffffffffe68._M_cur,in_stack_fffffffffffffe60);
  __init = local_c0;
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe58);
  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe58);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe58);
  __first1._M_current._4_4_ = uVar2;
  __first1._M_current._0_4_ = in_stack_fffffffffffffe80;
  this = (vector<double,_std::allocator<double>_> *)
         std::
         inner_product<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                   (__first1,__last1,
                    (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                    in_stack_fffffffffffffe70._M_cur,(double)__init);
  dVar3 = sqrt((double)this / (double)calculate_sd<sparse_parameters>::my_size);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  return dVar3;
}

Assistant:

double calculate_sd(vw& /* all */, T& weights)
{
  static int my_size = 0;
  for_each(weights.begin(), weights.end(), [](float /* v */) { my_size += 1; });
  double sum = accumulate(weights.begin(), weights.end(), 0.0);
  double mean = sum / my_size;
  vector<double> diff(my_size);
  transform(weights.begin(), weights.end(), diff.begin(), [mean](double x) { return x - mean; });
  double sq_sum = inner_product(diff.begin(), diff.end(), diff.begin(), 0.0);
  return sqrt(sq_sum / my_size);
}